

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_create_files(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  char *unaff_RBX;
  uv_fs_t *puVar3;
  uv_fs_event_t *puVar4;
  uv_timer_t *loop_00;
  uv_fs_event_t *puVar5;
  uv_fs_t uStack_1e8;
  uv_loop_t *puStack_30;
  code *pcStack_28;
  char *pcStack_20;
  
  if (fs_event_created < 0x10) {
    unaff_RBX = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_28 = (code *)0x14e1aa;
  pcStack_20 = unaff_RBX;
  loop = uv_default_loop();
  pcStack_28 = (code *)0x14e1bc;
  remove("watch_dir/file2");
  pcStack_28 = (code *)0x14e1cb;
  remove("watch_dir/file1");
  pcStack_28 = (code *)0x14e1d7;
  remove("watch_dir/");
  pcStack_28 = (code *)0x14e1e3;
  create_dir("watch_dir");
  pcStack_28 = (code *)0x14e1eb;
  create_file("watch_dir/file1");
  pcStack_28 = (code *)0x14e1f3;
  create_file("watch_dir/file2");
  pcStack_28 = (code *)0x14e202;
  loop_00 = (uv_timer_t *)loop;
  iVar1 = uv_fs_event_init(loop,&fs_event);
  if (iVar1 == 0) {
    puVar4 = &fs_event;
    pcStack_28 = (code *)0x14e226;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    loop_00 = (uv_timer_t *)puVar4;
    if (iVar1 != 0) goto LAB_0014e2fc;
    pcStack_28 = (code *)0x14e23d;
    loop_00 = (uv_timer_t *)loop;
    iVar1 = uv_timer_init(loop,&timer);
    if (iVar1 != 0) goto LAB_0014e301;
    loop_00 = &timer;
    pcStack_28 = (code *)0x14e262;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_0014e306;
    pcStack_28 = (code *)0x14e274;
    loop_00 = (uv_timer_t *)loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 1) goto LAB_0014e30b;
    if (timer_cb_called != 2) goto LAB_0014e310;
    if (close_cb_called != 2) goto LAB_0014e315;
    pcStack_28 = (code *)0x14e2a3;
    remove("watch_dir/file2");
    pcStack_28 = (code *)0x14e2af;
    remove("watch_dir/file1");
    pcStack_28 = (code *)0x14e2bb;
    remove("watch_dir/");
    pcStack_28 = (code *)0x14e2c0;
    loop = uv_default_loop();
    pcStack_28 = (code *)0x14e2d4;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStack_28 = (code *)0x14e2de;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStack_28 = (code *)0x14e2e3;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcStack_28 = (code *)0x14e2eb;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x14e2fc;
    run_test_fs_event_watch_file_cold_1();
LAB_0014e2fc:
    pcStack_28 = (code *)0x14e301;
    run_test_fs_event_watch_file_cold_2();
LAB_0014e301:
    pcStack_28 = (code *)0x14e306;
    run_test_fs_event_watch_file_cold_3();
LAB_0014e306:
    pcStack_28 = (code *)0x14e30b;
    run_test_fs_event_watch_file_cold_4();
LAB_0014e30b:
    pcStack_28 = (code *)0x14e310;
    run_test_fs_event_watch_file_cold_5();
LAB_0014e310:
    pcStack_28 = (code *)0x14e315;
    run_test_fs_event_watch_file_cold_6();
LAB_0014e315:
    pcStack_28 = (code *)0x14e31a;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_28 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_28 = (code *)0x192f1e;
  puVar4 = (uv_fs_event_t *)&uStack_1e8;
  puVar3 = &uStack_1e8;
  puVar5 = (uv_fs_event_t *)0x0;
  iVar2 = 0x41;
  puStack_30 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_1e8,(char *)loop_00,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup(&uStack_1e8);
    puVar5 = (uv_fs_event_t *)0x0;
    iVar2 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_1e8,iVar1,(uv_fs_cb)0x0);
    puVar4 = (uv_fs_event_t *)puVar3;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&uStack_1e8);
      return;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar5 == &fs_event) {
    if (iVar2 != 0) goto LAB_0014e3df;
    if (extraout_EDX != 2) goto LAB_0014e3e4;
    iVar1 = strcmp((char *)puVar4,"file2");
    if (iVar1 == 0) {
      puVar4 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_0014e3ee;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0014e3df:
    fs_event_cb_file_cold_2();
LAB_0014e3e4:
    puVar4 = puVar5;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_0014e3ee:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close((uv_handle_t *)puVar4,close_cb);
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT(fs_event_created < fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT(0 == uv_timer_start(&timer,
                               fs_event_create_files,
                               CREATE_TIMEOUT,
                               0));
  }
}